

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCDictSize_advanced
                 (size_t dictSize,ZSTD_compressionParameters cParams,
                 ZSTD_dictLoadMethod_e dictLoadMethod)

{
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t size;
  size_t local_40;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  
  sVar1 = ZSTD_cwksp_alloc_size(0x1390);
  sVar2 = ZSTD_cwksp_alloc_size(0x1900);
  useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(ZSTD_urm_auto,&cParams);
  sVar3 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,1,0);
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    local_40 = 0;
  }
  else {
    size = ZSTD_cwksp_align(dictSize,8);
    local_40 = ZSTD_cwksp_alloc_size(size);
  }
  return sVar1 + sVar2 + sVar3 + local_40;
}

Assistant:

size_t ZSTD_estimateCDictSize_advanced(
        size_t dictSize, ZSTD_compressionParameters cParams,
        ZSTD_dictLoadMethod_e dictLoadMethod)
{
    DEBUGLOG(5, "sizeof(ZSTD_CDict) : %u", (unsigned)sizeof(ZSTD_CDict));
    return ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
         + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
         /* enableDedicatedDictSearch == 1 ensures that CDict estimation will not be too small
          * in case we are using DDS with row-hash. */
         + ZSTD_sizeof_matchState(&cParams, ZSTD_resolveRowMatchFinderMode(ZSTD_urm_auto, &cParams),
                                  /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0)
         + (dictLoadMethod == ZSTD_dlm_byRef ? 0
            : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void *))));
}